

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O3

int SUNLinSolSolve_SPGMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,realtype delta)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  N_Vector *v;
  realtype **h;
  realtype *q;
  N_Vector z;
  realtype *b_00;
  N_Vector y;
  N_Vector x_00;
  N_Vector y_00;
  undefined8 uVar4;
  undefined8 uVar5;
  code *pcVar6;
  code *pcVar7;
  realtype *stemp;
  N_Vector *vtemp;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  double *pdVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint *puVar17;
  uint nvec;
  realtype *new_vk_norm;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  realtype rVar21;
  double dVar22;
  double dVar23;
  double local_e8;
  double local_90;
  double local_48;
  
  if (S == (SUNLinearSolver)0x0) {
    return -0x321;
  }
  puVar17 = (uint *)S->content;
  uVar12 = *puVar17;
  uVar18 = (ulong)uVar12;
  uVar14 = puVar17[2];
  uVar2 = puVar17[3];
  v = *(N_Vector **)(puVar17 + 0x18);
  h = *(realtype ***)(puVar17 + 0x1a);
  q = *(realtype **)(puVar17 + 0x1c);
  z = *(N_Vector *)(puVar17 + 0x1e);
  b_00 = *(realtype **)(puVar17 + 0x20);
  y = *(N_Vector *)(puVar17 + 0x22);
  x_00 = *(N_Vector *)(puVar17 + 0x14);
  y_00 = *(N_Vector *)(puVar17 + 0x16);
  uVar4 = *(undefined8 *)(puVar17 + 0xc);
  uVar5 = *(undefined8 *)(puVar17 + 0x12);
  pcVar6 = *(code **)(puVar17 + 10);
  pcVar7 = *(code **)(puVar17 + 0x10);
  stemp = *(realtype **)(puVar17 + 0x24);
  vtemp = *(N_Vector **)(puVar17 + 0x26);
  puVar17[5] = 0;
  if (pcVar6 == (code *)0x0) {
    puVar17[4] = 0;
    uVar12 = 0xfffffcdc;
  }
  else {
    uVar3 = puVar17[1];
    uVar9 = uVar3 & 0xfffffffe;
    if (pcVar7 == (code *)0x0 && ((uVar3 & 0xfffffffd) == 1 || uVar9 == 2)) {
      puVar17[4] = 0;
      uVar12 = 0xfffffcd9;
    }
    else {
      if (puVar17[4] == 0) {
        iVar10 = (*pcVar6)(uVar4,x,y);
        if (iVar10 != 0) {
LAB_004ea5e4:
          puVar17[4] = 0;
          uVar14 = 0xfffffcdb;
          uVar12 = 0x323;
LAB_004ea5f5:
          if (iVar10 < 0) {
            uVar12 = uVar14;
          }
          puVar17 = (uint *)S->content;
          goto LAB_004eada3;
        }
        N_VLinearSum(1.0,b,-1.0,y,y);
      }
      else {
        N_VScale(1.0,b,y);
      }
      N_VScale(1.0,y,*v);
      if ((uVar3 | 2) == 3) {
        iVar10 = (*pcVar7)(delta,uVar5,*v,y,1);
        if (iVar10 != 0) {
LAB_004ea5a0:
          puVar17[4] = 0;
          uVar12 = 0x325;
          if (iVar10 < 0) {
            uVar12 = 0xfffffcd8;
          }
          puVar17 = (uint *)S->content;
          goto LAB_004eada3;
        }
      }
      else {
        N_VScale(1.0,*v,y);
      }
      if (x_00 == (N_Vector)0x0) {
        N_VScale(1.0,y,*v);
      }
      else {
        N_VProd(x_00,y,*v);
      }
      rVar21 = N_VDotProd(*v,*v);
      dVar22 = 0.0;
      if (0.0 < rVar21) {
        rVar21 = N_VDotProd(*v,*v);
        if (rVar21 < 0.0) {
          dVar22 = sqrt(rVar21);
        }
        else {
          dVar22 = SQRT(rVar21);
        }
      }
      *(double *)(puVar17 + 6) = dVar22;
      if (dVar22 <= delta) {
        puVar17[4] = 0;
        puVar17 = (uint *)S->content;
LAB_004eac40:
        uVar12 = 0;
      }
      else {
        N_VConst(0.0,z);
        if ((int)uVar2 < 0) {
LAB_004ead94:
          puVar17[4] = 0;
          puVar17 = (uint *)S->content;
          uVar12 = 0x322;
        }
        else {
          uVar15 = 0;
          uVar16 = 0;
          local_e8 = dVar22;
          local_48 = dVar22;
          do {
            if ((int)uVar12 < 0) {
              N_VScale(1.0 / local_e8,*v,*v);
              bVar8 = false;
            }
            else {
              uVar19 = 0;
              do {
                if (0 < (int)uVar12) {
                  memset(h[uVar19],0,uVar18 * 8);
                }
                uVar19 = uVar19 + 1;
              } while (uVar12 + 1 != uVar19);
              N_VScale(1.0 / local_e8,*v,*v);
              if ((int)uVar12 < 1) {
                bVar8 = false;
              }
              else {
                bVar8 = true;
                lVar20 = 4;
                local_90 = 1.0;
                uVar19 = 0;
                do {
                  puVar17[5] = puVar17[5] + 1;
                  if (y_00 == (N_Vector)0x0) {
                    N_VScale(1.0,v[uVar19],y);
                  }
                  else {
                    N_VDiv(v[uVar19],y_00,y);
                  }
                  if (uVar9 == 2) {
                    N_VScale(1.0,y,v[uVar19 + 1]);
                    iVar10 = (*pcVar7)(delta,uVar5,v[uVar19 + 1],y,2);
                    if (iVar10 == 0) goto LAB_004ea87c;
LAB_004eac47:
                    puVar17[4] = 0;
                    uVar14 = 0xfffffcd8;
                    uVar12 = 0x325;
                    goto LAB_004ea5f5;
                  }
LAB_004ea87c:
                  iVar10 = (*pcVar6)(uVar4,y,v[uVar19 + 1]);
                  if (iVar10 != 0) goto LAB_004ea5e4;
                  if ((uVar3 | 2) == 3) {
                    iVar10 = (*pcVar7)(delta,uVar5,v[uVar19 + 1],y,1);
                    if (iVar10 != 0) goto LAB_004eac47;
                  }
                  else {
                    N_VScale(1.0,v[uVar19 + 1],y);
                  }
                  if (x_00 == (N_Vector)0x0) {
                    N_VScale(1.0,y,v[uVar19 + 1]);
                  }
                  else {
                    N_VProd(x_00,y,v[uVar19 + 1]);
                  }
                  uVar1 = uVar19 + 1;
                  new_vk_norm = (realtype *)((long)h[uVar19 + 1] + lVar20 + -4);
                  iVar10 = (int)uVar1;
                  if (uVar14 == 2) {
                    iVar11 = SUNClassicalGS(v,h,iVar10,uVar12,new_vk_norm,stemp,vtemp);
                  }
                  else {
                    iVar11 = SUNModifiedGS(v,h,iVar10,uVar12,new_vk_norm);
                  }
                  if (iVar11 != 0) {
                    puVar17[4] = 0;
                    puVar17 = (uint *)S->content;
                    uVar12 = 0xfffffcd6;
                    goto LAB_004eada3;
                  }
                  iVar10 = SUNQRfact(iVar10,h,q,(int)uVar19);
                  if (iVar10 != 0) {
                    puVar17[4] = 0;
                    puVar17 = (uint *)S->content;
                    uVar12 = 0x327;
                    goto LAB_004eada3;
                  }
                  local_90 = local_90 * *(double *)((long)q + lVar20 * 2);
                  local_48 = ABS(local_e8 * local_90);
                  *(double *)(puVar17 + 6) = local_48;
                  if (local_48 <= delta) {
                    uVar16 = (ulong)((int)uVar19 + 1);
                    break;
                  }
                  N_VScale(1.0 / h[uVar19 + 1][uVar19],v[uVar19 + 1],v[uVar19 + 1]);
                  bVar8 = (long)uVar1 < (long)(int)uVar12;
                  lVar20 = lVar20 + 8;
                  uVar19 = uVar1;
                  uVar16 = uVar18;
                } while (uVar18 != uVar1);
              }
            }
            *b_00 = local_e8;
            iVar10 = (int)uVar16;
            if (0 < iVar10) {
              memset(b_00 + 1,0,uVar16 * 8);
            }
            iVar11 = SUNQRsol(iVar10,h,q,b_00);
            if (iVar11 != 0) {
              puVar17[4] = 0;
              puVar17 = (uint *)S->content;
              uVar12 = 0xfffffcd5;
              goto LAB_004eada3;
            }
            *stemp = 1.0;
            *vtemp = z;
            if (0 < iVar10) {
              uVar19 = 0;
              do {
                stemp[uVar19 + 1] = b_00[uVar19];
                vtemp[uVar19 + 1] = v[uVar19];
                uVar19 = uVar19 + 1;
              } while (uVar16 != uVar19);
            }
            nvec = iVar10 + 1;
            iVar11 = N_VLinearCombination(nvec,stemp,vtemp,z);
            if (iVar11 != 0) {
              puVar17[4] = 0;
              puVar17 = (uint *)S->content;
              goto LAB_004eadc2;
            }
            if (bVar8) {
              if (y_00 != (N_Vector)0x0) {
                N_VDiv(z,y_00,z);
              }
              if (uVar9 == 2) {
                iVar10 = (*pcVar7)(delta,uVar5,z,y,2);
                if (iVar10 != 0) {
                  puVar17[4] = 0;
                  uVar12 = 0x325;
                  if (iVar10 < 0) {
                    uVar12 = 0xfffffcd8;
                  }
                  puVar17 = (uint *)S->content;
                  goto LAB_004eada3;
                }
              }
              else {
                N_VScale(1.0,z,y);
              }
              if (puVar17[4] == 0) {
                N_VLinearSum(1.0,x,1.0,y,x);
              }
              else {
                N_VScale(1.0,y,x);
              }
              puVar17[4] = 0;
              puVar17 = (uint *)S->content;
              goto LAB_004eac40;
            }
            if (uVar15 == uVar2) {
              if (dVar22 <= local_48) goto LAB_004ead94;
              if (y_00 != (N_Vector)0x0) {
                N_VDiv(z,y_00,z);
              }
              if (uVar9 == 2) {
                iVar10 = (*pcVar7)(delta,uVar5,z,y,2);
                if (iVar10 != 0) goto LAB_004ea5a0;
              }
              else {
                N_VScale(1.0,z,y);
              }
              if (puVar17[4] == 0) {
                N_VLinearSum(1.0,x,1.0,y,x);
              }
              else {
                N_VScale(1.0,y,x);
              }
              puVar17[4] = 0;
              puVar17 = (uint *)S->content;
              uVar12 = 0x321;
              goto LAB_004eada3;
            }
            dVar23 = 1.0;
            if (0 < iVar10) {
              pdVar13 = q + uVar16 * 2 + -1;
              uVar19 = uVar16 + 1;
              dVar23 = 1.0;
              do {
                b_00[uVar19 - 1] = pdVar13[-1] * dVar23;
                dVar23 = dVar23 * *pdVar13;
                pdVar13 = pdVar13 + -2;
                uVar19 = uVar19 - 1;
              } while (1 < uVar19);
            }
            *b_00 = dVar23;
            if (-1 < iVar10) {
              uVar19 = 0;
              do {
                b_00[uVar19] = b_00[uVar19] * local_e8 * dVar23;
                uVar19 = uVar19 + 1;
              } while (nvec != uVar19);
              if (-1 < iVar10) {
                uVar19 = 0;
                do {
                  stemp[uVar19] = b_00[uVar19];
                  vtemp[uVar19] = v[uVar19];
                  uVar19 = uVar19 + 1;
                } while (nvec != uVar19);
              }
            }
            local_e8 = ABS(local_e8 * dVar23);
            iVar10 = N_VLinearCombination(nvec,stemp,vtemp,*v);
            uVar15 = uVar15 + 1;
          } while (iVar10 == 0);
          puVar17[4] = 0;
          puVar17 = (uint *)S->content;
LAB_004eadc2:
          uVar12 = 0xfffffcd4;
        }
      }
    }
  }
LAB_004eada3:
  puVar17[8] = uVar12;
  return uVar12;
}

Assistant:

int SUNLinSolSolve_SPGMR(SUNLinearSolver S, SUNMatrix A, N_Vector x,
                         N_Vector b, realtype delta)
{
  /* local data and shortcut variables */
  N_Vector *V, xcor, vtemp, s1, s2;
  realtype **Hes, *givens, *yg, *res_norm;
  realtype beta, rotation_product, r_norm, s_product, rho;
  booleantype preOnLeft, preOnRight, scale2, scale1, converged;
  booleantype *zeroguess;
  int i, j, k, l, l_plus_1, l_max, krydim, ier, ntries, max_restarts, gstype;
  int *nli;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;

  /* local shortcuts for fused vector operations */
  realtype* cv;
  N_Vector* Xv;

  /* Initialize some variables */
  l_plus_1 = 0;
  krydim = 0;

  /* Make local shorcuts to solver variables. */
  if (S == NULL) return(SUNLS_MEM_NULL);
  l_max        = SPGMR_CONTENT(S)->maxl;
  max_restarts = SPGMR_CONTENT(S)->max_restarts;
  gstype       = SPGMR_CONTENT(S)->gstype;
  V            = SPGMR_CONTENT(S)->V;
  Hes          = SPGMR_CONTENT(S)->Hes;
  givens       = SPGMR_CONTENT(S)->givens;
  xcor         = SPGMR_CONTENT(S)->xcor;
  yg           = SPGMR_CONTENT(S)->yg;
  vtemp        = SPGMR_CONTENT(S)->vtemp;
  s1           = SPGMR_CONTENT(S)->s1;
  s2           = SPGMR_CONTENT(S)->s2;
  A_data       = SPGMR_CONTENT(S)->ATData;
  P_data       = SPGMR_CONTENT(S)->PData;
  atimes       = SPGMR_CONTENT(S)->ATimes;
  psolve       = SPGMR_CONTENT(S)->Psolve;
  zeroguess    = &(SPGMR_CONTENT(S)->zeroguess);
  nli          = &(SPGMR_CONTENT(S)->numiters);
  res_norm     = &(SPGMR_CONTENT(S)->resnorm);
  cv           = SPGMR_CONTENT(S)->cv;
  Xv           = SPGMR_CONTENT(S)->Xv;

  /* Initialize counters and convergence flag */
  *nli = 0;
  converged = SUNFALSE;

  /* Set booleantype flags for internal solver options */
  preOnLeft  = ( (SPGMR_CONTENT(S)->pretype == SUN_PREC_LEFT) ||
                 (SPGMR_CONTENT(S)->pretype == SUN_PREC_BOTH) );
  preOnRight = ( (SPGMR_CONTENT(S)->pretype == SUN_PREC_RIGHT) ||
                 (SPGMR_CONTENT(S)->pretype == SUN_PREC_BOTH) );
  scale1 = (s1 != NULL);
  scale2 = (s2 != NULL);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  if (SPGMR_CONTENT(S)->print_level && SPGMR_CONTENT(S)->info_file
      && (SPGMR_CONTENT(S)->info_file != S->sunctx->logger->info_fp))
    fprintf(SPGMR_CONTENT(S)->info_file, "SUNLINSOL_SPGMR:\n");
#endif

  /* Check if Atimes function has been set */
  if (atimes == NULL) {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_ATIMES_NULL;
    return(LASTFLAG(S));
  }

  /* If preconditioning, check if psolve has been set */
  if ((preOnLeft || preOnRight) && psolve == NULL) {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_PSOLVE_NULL;
    return(LASTFLAG(S));
  }

  /* Set vtemp and V[0] to initial (unscaled) residual r_0 = b - A*x_0 */
  if (*zeroguess) {
    N_VScale(ONE, b, vtemp);
  } else {
    ier = atimes(A_data, x, vtemp);
    if (ier != 0) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
      return(LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, vtemp, vtemp);
  }
  N_VScale(ONE, vtemp, V[0]);

  /* Apply left preconditioner and left scaling to V[0] = r_0 */
  if (preOnLeft) {
    ier = psolve(P_data, V[0], vtemp, delta, SUN_PREC_LEFT);
    if (ier != 0) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (ier < 0) ?
        SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
      return(LASTFLAG(S));
    }
  } else {
    N_VScale(ONE, V[0], vtemp);
  }

  if (scale1) {
    N_VProd(s1, vtemp, V[0]);
  } else {
    N_VScale(ONE, vtemp, V[0]);
  }

  /* Set r_norm = beta to L2 norm of V[0] = s1 P1_inv r_0, and
     return if small  */
  *res_norm = r_norm = beta = SUNRsqrt(N_VDotProd(V[0], V[0]));

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  /* print initial residual */
  if (SPGMR_CONTENT(S)->print_level && SPGMR_CONTENT(S)->info_file
      && (SPGMR_CONTENT(S)->info_file != S->sunctx->logger->info_fp))
  {
    fprintf(SPGMR_CONTENT(S)->info_file,
            SUNLS_MSG_RESIDUAL,
            (long int) 0, *res_norm);
  }
  SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
    "SUNLinSolSolve_SPGMR", "initial-residual",
    "nli = %li, resnorm = %.16g", (long int) 0, *res_norm);
#endif

  if (r_norm <= delta) {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_SUCCESS;
    return(LASTFLAG(S));
  }

  /* Initialize rho to avoid compiler warning message */
  rho = beta;

  /* Set xcor = 0 */
  N_VConst(ZERO, xcor);

  /* Begin outer iterations: up to (max_restarts + 1) attempts */
  for (ntries=0; ntries<=max_restarts; ntries++) {

    /* Initialize the Hessenberg matrix Hes and Givens rotation
       product.  Normalize the initial vector V[0] */
    for (i=0; i<=l_max; i++)
      for (j=0; j<l_max; j++)
        Hes[i][j] = ZERO;

    rotation_product = ONE;
    N_VScale(ONE/r_norm, V[0], V[0]);

    /* Inner loop: generate Krylov sequence and Arnoldi basis */
    for (l=0; l<l_max; l++) {
      (*nli)++;
      krydim = l_plus_1 = l + 1;

      /* Generate A-tilde V[l], where A-tilde = s1 P1_inv A P2_inv s2_inv */

      /*   Apply right scaling: vtemp = s2_inv V[l] */
      if (scale2) N_VDiv(V[l], s2, vtemp);
      else N_VScale(ONE, V[l], vtemp);

      /*   Apply right preconditioner: vtemp = P2_inv s2_inv V[l] */
      if (preOnRight) {
        N_VScale(ONE, vtemp, V[l_plus_1]);
        ier = psolve(P_data, V[l_plus_1], vtemp, delta, SUN_PREC_RIGHT);
        if (ier != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (ier < 0) ?
            SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
          return(LASTFLAG(S));
        }
      }

      /* Apply A: V[l+1] = A P2_inv s2_inv V[l] */
      ier = atimes( A_data, vtemp, V[l_plus_1] );
      if (ier != 0) {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
        return(LASTFLAG(S));
      }

      /* Apply left preconditioning: vtemp = P1_inv A P2_inv s2_inv V[l] */
      if (preOnLeft) {
        ier = psolve(P_data, V[l_plus_1], vtemp, delta, SUN_PREC_LEFT);
        if (ier != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (ier < 0) ?
            SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
          return(LASTFLAG(S));
        }
      } else {
        N_VScale(ONE, V[l_plus_1], vtemp);
      }

      /* Apply left scaling: V[l+1] = s1 P1_inv A P2_inv s2_inv V[l] */
      if (scale1) {
        N_VProd(s1, vtemp, V[l_plus_1]);
      } else {
        N_VScale(ONE, vtemp, V[l_plus_1]);
      }

      /*  Orthogonalize V[l+1] against previous V[i]: V[l+1] = w_tilde */
      if (gstype == SUN_CLASSICAL_GS) {
        if (SUNClassicalGS(V, Hes, l_plus_1, l_max, &(Hes[l_plus_1][l]),
                           cv, Xv) != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = SUNLS_GS_FAIL;
          return(LASTFLAG(S));
        }
      } else {
        if (SUNModifiedGS(V, Hes, l_plus_1, l_max, &(Hes[l_plus_1][l])) != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = SUNLS_GS_FAIL;
          return(LASTFLAG(S));
        }
      }

      /*  Update the QR factorization of Hes */
      if(SUNQRfact(krydim, Hes, givens, l) != 0 ) {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = SUNLS_QRFACT_FAIL;
        return(LASTFLAG(S));
      }

      /*  Update residual norm estimate; break if convergence test passes */
      rotation_product *= givens[2*l+1];
      *res_norm = rho = SUNRabs(rotation_product*r_norm);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
      /* print current iteration number and the residual */
      if (SPGMR_CONTENT(S)->print_level && SPGMR_CONTENT(S)->info_file
          && (SPGMR_CONTENT(S)->info_file != S->sunctx->logger->info_fp))
      {
        fprintf(SPGMR_CONTENT(S)->info_file,
                SUNLS_MSG_RESIDUAL,
                (long int) *nli, *res_norm);
      }
      SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
        "SUNLinSolSolve_SPGMR", "iterate-residual",
        "nli = %li, resnorm = %.16g", (long int) *nli, *res_norm);
#endif

      if (rho <= delta) { converged = SUNTRUE; break; }

      /* Normalize V[l+1] with norm value from the Gram-Schmidt routine */
      N_VScale(ONE/Hes[l_plus_1][l], V[l_plus_1], V[l_plus_1]);
    }

    /* Inner loop is done.  Compute the new correction vector xcor */

    /*   Construct g, then solve for y */
    yg[0] = r_norm;
    for (i=1; i<=krydim; i++) yg[i]=ZERO;
    if (SUNQRsol(krydim, Hes, givens, yg) != 0) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_QRSOL_FAIL;
      return(LASTFLAG(S));
    }

    /*   Add correction vector V_l y to xcor */
    cv[0] = ONE;
    Xv[0] = xcor;

    for (k=0; k<krydim; k++) {
      cv[k+1] = yg[k];
      Xv[k+1] = V[k];
    }
    ier = N_VLinearCombination(krydim+1, cv, Xv, xcor);
    if (ier != SUNLS_SUCCESS) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_VECTOROP_ERR;
      return(SUNLS_VECTOROP_ERR);
    }

    /* If converged, construct the final solution vector x and return */
    if (converged) {

      /* Apply right scaling and right precond.: vtemp = P2_inv s2_inv xcor */
      if (scale2) N_VDiv(xcor, s2, xcor);
      if (preOnRight) {
        ier = psolve(P_data, xcor, vtemp, delta, SUN_PREC_RIGHT);
        if (ier != 0) {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (ier < 0) ?
            SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
          return(LASTFLAG(S));
        }
      } else {
        N_VScale(ONE, xcor, vtemp);
      }

      /* Add vtemp to initial x to get final solution x, and return */
      if (*zeroguess)
        N_VScale(ONE, vtemp, x);
      else
        N_VLinearSum(ONE, x, ONE, vtemp, x);

      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_SUCCESS;
      return(LASTFLAG(S));
    }

    /* Not yet converged; if allowed, prepare for restart */
    if (ntries == max_restarts) break;

    /* Construct last column of Q in yg */
    s_product = ONE;
    for (i=krydim; i>0; i--) {
      yg[i] = s_product*givens[2*i-2];
      s_product *= givens[2*i-1];
    }
    yg[0] = s_product;

    /* Scale r_norm and yg */
    r_norm *= s_product;
    for (i=0; i<=krydim; i++)
      yg[i] *= r_norm;
    r_norm = SUNRabs(r_norm);

    /* Multiply yg by V_(krydim+1) to get last residual vector; restart */
    for (k=0; k<=krydim; k++) {
      cv[k] = yg[k];
      Xv[k] = V[k];
    }
    ier = N_VLinearCombination(krydim+1, cv, Xv, V[0]);
    if (ier != SUNLS_SUCCESS) {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = SUNLS_VECTOROP_ERR;
      return(SUNLS_VECTOROP_ERR);
    }

  }

  /* Failed to converge, even after allowed restarts.
     If the residual norm was reduced below its initial value, compute
     and return x anyway.  Otherwise return failure flag. */
  if (rho < beta) {

    /* Apply right scaling and right precond.: vtemp = P2_inv s2_inv xcor */
    if (scale2) N_VDiv(xcor, s2, xcor);
    if (preOnRight) {
      ier = psolve(P_data, xcor, vtemp, delta, SUN_PREC_RIGHT);
      if (ier != 0) {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (ier < 0) ?
          SUNLS_PSOLVE_FAIL_UNREC : SUNLS_PSOLVE_FAIL_REC;
        return(LASTFLAG(S));
      }
    } else {
      N_VScale(ONE, xcor, vtemp);
    }

    /* Add vtemp to initial x to get final solution x, and return */
    if (*zeroguess)
      N_VScale(ONE, vtemp, x);
    else
      N_VLinearSum(ONE, x, ONE, vtemp, x);

    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_RES_REDUCED;
    return(LASTFLAG(S));
  }

  *zeroguess  = SUNFALSE;
  LASTFLAG(S) = SUNLS_CONV_FAIL;
  return(LASTFLAG(S));
}